

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__4>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  string *err;
  bool bVar3;
  reference pbVar4;
  string *err_00;
  ostream *poVar5;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *o;
  int target;
  size_t byteStride;
  int buffer;
  size_t byteLength;
  size_t byteOffset;
  stringstream ss;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator end;
  string local_3c8;
  uint local_3a4;
  size_t local_3a0;
  int local_394;
  char *local_390;
  size_t local_388;
  size_t local_380;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368 [7];
  ios_base local_2f8 [264];
  undefined1 local_1f0 [272];
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  bool local_a0;
  json_const_iterator local_98;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar3 = FindMember(_v,"bufferViews",&local_98);
  if ((bVar3) &&
     (pbVar4 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_98), pbVar4->m_type == array)) {
    pbVar4 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_98);
    local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_70.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_70.m_object = pbVar4;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_begin(&local_70);
    local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_50.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_50.m_object = pbVar4;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end(&local_50);
    bVar3 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_70,&local_50);
    if (!bVar3) {
      paVar1 = &local_3c8.field_2;
      local_390 = member;
      do {
        err_00 = (string *)
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_70);
        if (*(char *)&(err_00->_M_dataplus)._M_p != '\x01') {
          if ((char *)**(undefined8 **)member == (char *)0x0) {
            return false;
          }
          std::__cxx11::string::append((char *)**(undefined8 **)member);
          return false;
        }
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1f0._32_4_ = -1;
        local_1f0._72_4_ = 0;
        local_1f0._76_4_ = 0;
        local_1f0._80_8_ = 0.0;
        local_1f0._56_4_ = 0;
        local_1f0._60_4_ = 0;
        local_1f0._64_4_ = 0;
        local_1f0._40_8_ = 0;
        local_1f0._48_4_ = 0;
        local_1f0._52_4_ = 0;
        local_1f0._88_8_ = local_1f0 + 0x68;
        local_1f0._96_8_ = 0;
        local_1f0[0x68] = '\0';
        local_1f0._176_4_ = _S_red;
        local_1f0._184_8_ = (_Base_ptr)0x0;
        local_1f0._152_8_ = (pointer)0x0;
        local_1f0._160_8_ = (pointer)0x0;
        local_1f0._136_8_ = (pointer)0x0;
        local_1f0._144_8_ = (pointer)0x0;
        local_1f0._120_8_ = (pointer)0x0;
        local_1f0._128_8_ = (pointer)0x0;
        local_1f0._192_8_ = local_1f0 + 0xb0;
        local_1f0._208_8_ = 0;
        local_1f0[0xd8] = false;
        local_1f0._232_4_ = _S_red;
        local_1f0._240_8_ = (_Base_ptr)0x0;
        local_1f0._248_8_ = local_1f0 + 0xe8;
        local_1f0._264_8_ = 0;
        local_e0._M_p = (pointer)&local_d0;
        local_d8 = 0;
        local_d0._M_local_buf[0] = '\0';
        local_c0._M_p = (pointer)&local_b0;
        local_b8 = 0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = false;
        err = (string *)**(undefined8 **)member;
        cVar2 = *(char *)(*(long *)(member + 8) + 0x19);
        local_394 = -1;
        local_378._0_8_ = local_378 + 0x10;
        local_378._8_8_ = (_Base_ptr)0x6;
        local_368[0]._0_7_ = 0x726566667562;
        local_3c8.field_2._M_allocated_capacity = 0x6956726566667542;
        local_3c8.field_2._8_2_ = 0x7765;
        local_3c8._M_string_length = 10;
        local_3c8.field_2._M_local_buf[10] = '\0';
        local_3c8._M_dataplus._M_p = (pointer)paVar1;
        local_1f0._200_8_ = local_1f0._192_8_;
        local_1f0._256_8_ = local_1f0._248_8_;
        bVar3 = ParseIntegerProperty
                          (&local_394,err,(json *)err_00,(string *)local_378,true,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_);
        }
        if (!bVar3) {
LAB_001122b2:
          BufferView::~BufferView((BufferView *)local_1f0);
          return false;
        }
        local_380 = 0;
        local_378._0_8_ = local_378 + 0x10;
        local_368[0]._M_allocated_capacity = 0x7366664f65747962;
        local_378._8_8_ = (_Base_ptr)0xa;
        local_368[0]._8_3_ = 0x7465;
        local_3c8._M_string_length = 0;
        local_3c8.field_2._M_allocated_capacity =
             local_3c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_3c8._M_dataplus._M_p = (pointer)paVar1;
        ParseUnsignedProperty(&local_380,err,(json *)err_00,(string *)local_378,false,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_);
        }
        local_388 = 1;
        local_378._0_8_ = local_378 + 0x10;
        local_368[0]._M_allocated_capacity = 0x676e654c65747962;
        local_378._8_8_ = (_Base_ptr)0xa;
        local_368[0]._8_3_ = 0x6874;
        local_3c8.field_2._M_allocated_capacity = 0x6956726566667542;
        local_3c8.field_2._8_2_ = 0x7765;
        local_3c8._M_string_length = 10;
        local_3c8.field_2._M_local_buf[10] = '\0';
        local_3c8._M_dataplus._M_p = (pointer)paVar1;
        bVar3 = ParseUnsignedProperty
                          (&local_388,err,(json *)err_00,(string *)local_378,true,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_);
        }
        if (!bVar3) goto LAB_001122b2;
        local_3a0 = 0;
        local_378._0_8_ = local_378 + 0x10;
        local_368[0]._M_allocated_capacity = 0x6972745365747962;
        local_378._8_8_ = (_Base_ptr)0xa;
        local_368[0]._8_3_ = 0x6564;
        local_3c8._M_string_length = 0;
        local_3c8.field_2._M_allocated_capacity =
             local_3c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_3c8._M_dataplus._M_p = (pointer)paVar1;
        bVar3 = ParseUnsignedProperty
                          (&local_3a0,err,(json *)err_00,(string *)local_378,false,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_);
        }
        member = local_390;
        if (!bVar3) {
          local_3a0 = 0;
        }
        if ((0xfc < local_3a0) || ((local_3a0 & 3) != 0)) {
          if (err != (string *)0x0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_378);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_378 + 0x10),
                       "Invalid `byteStride\' value. `byteStride\' must be the multiple of 4 : ",
                       0x45);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)(local_378 + 0x10));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)err,(ulong)local_3c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_378);
            std::ios_base::~ios_base(local_2f8);
          }
          goto LAB_001122b2;
        }
        local_3a4 = 0;
        local_378._0_8_ = local_378 + 0x10;
        local_378._8_8_ = (_Base_ptr)0x6;
        local_368[0]._0_7_ = 0x746567726174;
        local_3c8._M_string_length = 0;
        local_3c8.field_2._M_allocated_capacity =
             local_3c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_3c8._M_dataplus._M_p = (pointer)paVar1;
        ParseIntegerProperty
                  ((int *)&local_3a4,err,(json *)err_00,(string *)local_378,false,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_);
        }
        if ((local_3a4 & 0xfffffffe) != 0x8892) {
          local_3a4 = 0;
        }
        local_378._0_8_ = local_378 + 0x10;
        local_378._8_8_ = (_Base_ptr)0x4;
        local_368[0]._0_5_ = 0x656d616e;
        local_3c8._M_string_length = 0;
        local_3c8.field_2._M_allocated_capacity =
             local_3c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_3c8._M_dataplus._M_p = (pointer)paVar1;
        local_1f0._64_4_ = local_3a4;
        ParseStringProperty((string *)local_1f0,err,(json *)err_00,(string *)local_378,false,
                            &local_3c8);
        o = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c8._M_dataplus._M_p);
          o = extraout_RDX_00;
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_);
          o = extraout_RDX_01;
        }
        ParseExtensionsProperty((ExtensionMap *)(local_1f0 + 0xe0),err_00,o);
        ParseExtrasProperty((Value *)(local_1f0 + 0x48),(json *)err_00);
        if (cVar2 != '\0') {
          local_378._0_8_ = (pointer)0x0;
          local_378._8_8_ = (_Base_ptr)0x0;
          local_368[0]._M_allocated_capacity = 0;
          local_368[0]._8_8_ = 0x8000000000000000;
          bVar3 = FindMember((json *)err_00,"extensions",(json_const_iterator *)local_378);
          if (bVar3) {
            pbVar4 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_378);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_3c8,pbVar4,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
          }
          local_378._0_8_ = (pointer)0x0;
          local_378._8_8_ = (_Base_ptr)0x0;
          local_368[0]._M_allocated_capacity = 0;
          local_368[0]._8_8_ = 0x8000000000000000;
          bVar3 = FindMember((json *)err_00,"extras",(json_const_iterator *)local_378);
          if (bVar3) {
            pbVar4 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_378);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_3c8,pbVar4,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
          }
        }
        local_1f0._32_4_ = local_394;
        local_1f0._40_8_ = local_380;
        local_1f0._48_4_ = (undefined4)local_388;
        local_1f0._52_4_ = (undefined4)(local_388 >> 0x20);
        local_1f0._56_4_ = (undefined4)local_3a0;
        local_1f0._60_4_ = (undefined4)(local_3a0 >> 0x20);
        std::vector<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>::
        emplace_back<tinygltf::BufferView>
                  ((vector<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_> *)
                   (**(long **)(member + 0x10) + 0x48),(BufferView *)local_1f0);
        BufferView::~BufferView((BufferView *)local_1f0);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_70);
        bVar3 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_70,&local_50);
      } while (!bVar3);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}